

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

shared_ptr<pbrt::syntactic::Texture> __thiscall
pbrt::syntactic::Attributes::findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
          (Attributes *this,shared_ptr<pbrt::syntactic::Texture> *item,string *name)

{
  _Base_ptr p_Var1;
  element_type *item_00;
  pointer pcVar2;
  iterator iVar3;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<pbrt::syntactic::Texture> sVar5;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined1 local_30 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
                  *)(item + 0xe),in_RCX);
  _Var4._M_pi = extraout_RDX;
  if (iVar3._M_node ==
      (_Base_ptr)
      &item[0xe].super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount) {
    item_00 = item[7].super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (item_00 == (element_type *)0x0) {
      (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_50._0_8_ = (name->_M_dataplus)._M_p;
      local_50._8_8_ = name->_M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
        }
      }
      pcVar2 = (in_RCX->_M_dataplus)._M_p;
      local_40._M_allocated_capacity = (size_type)local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_50 + 0x10),pcVar2,pcVar2 + in_RCX->_M_string_length);
      sVar5 = findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
                        (this,(shared_ptr<pbrt::syntactic::Texture> *)item_00,(string *)local_50);
      _Var4 = sVar5.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if ((undefined1 *)local_40._M_allocated_capacity != local_30) {
        operator_delete((void *)local_40._M_allocated_capacity);
        _Var4._M_pi = extraout_RDX_00;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
        _Var4._M_pi = extraout_RDX_01;
      }
    }
  }
  else {
    (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = *(element_type **)(iVar3._M_node + 2);
    p_Var1 = iVar3._M_node[2]._M_parent;
    (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  sVar5.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pbrt::syntactic::Texture>)
         sVar5.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Item findNamedItem(Item item, std::string name) {
        auto &items = get(Item{});
        auto it = items.find(name);
        if (it != items.end()) return it->second;
        if (parent) return parent->findNamedItem(item,name);
        return nullptr;
      }